

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O0

stbtt__active_edge *
stbtt__new_active(stbtt__hheap *hh,stbtt__edge *e,int off_x,float start_point,void *userdata)

{
  stbtt__active_edge *psVar1;
  void *in_RCX;
  int in_EDX;
  stbtt__hheap *in_RSI;
  float in_XMM0_Da;
  float fVar2;
  float dxdy;
  stbtt__active_edge *z;
  float local_3c;
  float local_38;
  
  psVar1 = (stbtt__active_edge *)stbtt__hheap_alloc(in_RSI,CONCAT44(in_EDX,in_XMM0_Da),in_RCX);
  fVar2 = (*(float *)&in_RSI->first_free - *(float *)&in_RSI->head) /
          (*(float *)((long)&in_RSI->first_free + 4) - *(float *)((long)&in_RSI->head + 4));
  if (psVar1 != (stbtt__active_edge *)0x0) {
    psVar1->fdx = fVar2;
    if ((fVar2 != 0.0) || (NAN(fVar2))) {
      local_38 = 1.0 / fVar2;
    }
    else {
      local_38 = 0.0;
    }
    psVar1->fdy = local_38;
    psVar1->fx = fVar2 * (in_XMM0_Da - *(float *)((long)&in_RSI->head + 4)) +
                 *(float *)&in_RSI->head;
    psVar1->fx = psVar1->fx - (float)in_EDX;
    local_3c = 1.0;
    if (in_RSI->num_remaining_in_head_chunk == 0) {
      local_3c = -1.0;
    }
    psVar1->direction = local_3c;
    psVar1->sy = *(float *)((long)&in_RSI->head + 4);
    psVar1->ey = *(float *)((long)&in_RSI->first_free + 4);
    psVar1->next = (stbtt__active_edge *)0x0;
  }
  return psVar1;
}

Assistant:

static stbtt__active_edge *stbtt__new_active(stbtt__hheap *hh, stbtt__edge *e, int off_x, float start_point, void *userdata)
{
   stbtt__active_edge *z = (stbtt__active_edge *) stbtt__hheap_alloc(hh, sizeof(*z), userdata);
   float dxdy = (e->x1 - e->x0) / (e->y1 - e->y0);
   STBTT_assert(z != NULL);
   //STBTT_assert(e->y0 <= start_point);
   if (!z) return z;
   z->fdx = dxdy;
   z->fdy = dxdy != 0.0f ? (1.0f/dxdy) : 0.0f;
   z->fx = e->x0 + dxdy * (start_point - e->y0);
   z->fx -= off_x;
   z->direction = e->invert ? 1.0f : -1.0f;
   z->sy = e->y0;
   z->ey = e->y1;
   z->next = 0;
   return z;
}